

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary_t.cpp
# Opt level: O0

void __thiscall deci::dictionary_t::Remove(dictionary_t *this,value_t *key)

{
  bool bVar1;
  runtime_error *this_00;
  _Node_iterator_base<std::pair<deci::value_t_*const,_deci::value_t_*>,_true> local_30;
  _Node_iterator_base<std::pair<deci::value_t_*const,_deci::value_t_*>,_true> local_28;
  iterator i;
  value_t *xkey;
  value_t *key_local;
  dictionary_t *this_local;
  
  i.super__Node_iterator_base<std::pair<deci::value_t_*const,_deci::value_t_*>,_true>._M_cur =
       (_Node_iterator_base<std::pair<deci::value_t_*const,_deci::value_t_*>,_true>)
       (_Node_iterator_base<std::pair<deci::value_t_*const,_deci::value_t_*>,_true>)key;
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<deci::value_t_*,_deci::value_t_*,_deci::value_hash_t,_deci::value_equal_to_t,_std::allocator<std::pair<deci::value_t_*const,_deci::value_t_*>_>_>
       ::find(&this->storage,(key_type *)&i);
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_map<deci::value_t_*,_deci::value_t_*,_deci::value_hash_t,_deci::value_equal_to_t,_std::allocator<std::pair<deci::value_t_*const,_deci::value_t_*>_>_>
       ::end(&this->storage);
  bVar1 = std::__detail::operator==(&local_28,&local_30);
  if (!bVar1) {
    std::
    unordered_map<deci::value_t_*,_deci::value_t_*,_deci::value_hash_t,_deci::value_equal_to_t,_std::allocator<std::pair<deci::value_t_*const,_deci::value_t_*>_>_>
    ::erase(&this->storage,(iterator)local_28._M_cur);
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Element not found");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void dictionary_t::Remove(const value_t& key) {
    value_t* xkey = &const_cast<value_t&>(key);
    auto i = this->storage.find(xkey);
    if (i == this->storage.end()) {
      throw std::runtime_error("Element not found");
    }
    this->storage.erase(i);
  }